

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_trailer_headers(nghttp2_session *session,nghttp2_stream *stream,nghttp2_frame *frame)

{
  bool local_29;
  nghttp2_frame *frame_local;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if ((stream == (nghttp2_stream *)0x0) || ((frame->hd).type != '\x01')) {
    session_local._4_4_ = 0;
  }
  else if (session->server == '\0') {
    local_29 = false;
    if ((frame->headers).cat == NGHTTP2_HCAT_HEADERS) {
      local_29 = (stream->http_flags & 0x4000) == 0;
    }
    session_local._4_4_ = (uint)local_29;
  }
  else {
    session_local._4_4_ = (uint)((frame->headers).cat == NGHTTP2_HCAT_HEADERS);
  }
  return session_local._4_4_;
}

Assistant:

static int session_trailer_headers(nghttp2_session *session,
                                   nghttp2_stream *stream,
                                   nghttp2_frame *frame) {
  if (!stream || frame->hd.type != NGHTTP2_HEADERS) {
    return 0;
  }
  if (session->server) {
    return frame->headers.cat == NGHTTP2_HCAT_HEADERS;
  }

  return frame->headers.cat == NGHTTP2_HCAT_HEADERS &&
         (stream->http_flags & NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE) == 0;
}